

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

obj * create_oprop(level *lev,obj *otmp,boolean allow_detrimental)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  xchar *pxVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  bool bVar14;
  int candidates [128];
  uint auStack_238 [130];
  
  if (otmp == (obj *)0x0) {
    uVar6 = 4;
    do {
      iVar13 = 0;
      pxVar7 = &u.weapon_skills[1].max_skill;
      uVar9 = 1;
      do {
        if (((int)uVar6 <= (int)*pxVar7) && ((int)uVar6 <= (int)((skills *)(pxVar7 + -1))->skill)) {
          lVar10 = (long)iVar13;
          iVar13 = iVar13 + 1;
          auStack_238[lVar10] = (uint)uVar9;
        }
        if (0x7f < iVar13) break;
        pxVar7 = pxVar7 + 4;
        bVar14 = uVar9 < 0x1c;
        uVar9 = uVar9 + 1;
      } while (bVar14);
      if (iVar13 == 0) goto LAB_0014a0a1;
      uVar3 = mt_random();
      uVar3 = auStack_238[SUB168(ZEXT416(uVar3) % SEXT816((long)iVar13),0)];
      switch(uVar3) {
      case 1:
        if (urace.malenum == 0x111) {
          uVar8 = 0x12;
        }
        else if (urace.malenum == 0x4a) {
          uVar8 = 0x13;
        }
        else {
          uVar8 = 0x15;
          if (urole.malenum != 0x168) goto switchD_00149f15_caseD_3;
        }
        break;
      case 2:
        uVar8 = 0x16;
        if (urole.malenum != 0x15e) goto switchD_00149f15_caseD_3;
        break;
      case 3:
      case 4:
        goto switchD_00149f15_caseD_3;
      case 5:
        if (urace.malenum == 0x2d) {
          uVar8 = 0x20;
        }
        else if (urace.malenum == 0x111) {
          uVar8 = 0x1e;
        }
        else {
          if (urace.malenum != 0x4a) {
            uVar8 = 0x1d;
            goto LAB_0014a015;
          }
          uVar8 = 0x1f;
        }
        break;
      case 6:
        uVar8 = 0x25;
        if (urace.malenum != 0x111) goto switchD_00149f15_caseD_3;
        break;
      case 7:
        uVar8 = 0x28;
        goto LAB_0014a015;
      case 8:
        uVar8 = 0x29;
LAB_0014a015:
        if (urole.malenum != 0x165) {
switchD_00149f15_caseD_3:
          uVar8 = 0;
        }
        break;
      default:
        if (uVar3 != 0x16) goto switchD_00149f15_caseD_3;
        if (urace.malenum == 0x4a) {
          uVar4 = mt_random();
          uVar8 = 0x44;
          uVar5 = 3;
        }
        else {
          if (urace.malenum != 0x111) {
            if (urole.malenum == 0x165) {
              uVar8 = mt_random();
              uVar8 = (uVar8 & 1) << 6 | 5;
              break;
            }
            goto switchD_00149f15_caseD_3;
          }
          uVar4 = mt_random();
          uVar8 = 0x43;
          uVar5 = 2;
        }
        if ((uVar4 & 1) == 0) {
          uVar8 = uVar5;
        }
      }
      if (uVar8 != 0) goto LAB_0014a10c;
      iVar13 = 0;
      uVar8 = 1;
      lVar10 = 0x3b;
      do {
        bVar1 = *(byte *)((long)&objects->oc_name_idx + lVar10);
        bVar12 = (char)bVar1 >> 7;
        if (uVar3 == (byte)((bVar1 ^ bVar12) - bVar12)) {
          lVar11 = (long)iVar13;
          iVar13 = iVar13 + 1;
          auStack_238[lVar11] = uVar8;
        }
        if (iVar13 == 0x80) {
          iVar13 = 0x80;
          break;
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xb53);
      if (iVar13 != 0) {
        uVar6 = mt_random();
        uVar8 = auStack_238[SUB168(ZEXT416(uVar6) % SEXT816((long)iVar13),0)];
        goto LAB_0014a10c;
      }
      impossible("found no weapons for skill %d?");
LAB_0014a0a1:
      bVar14 = 2 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar14);
    uVar8 = 0;
LAB_0014a10c:
    if (uVar8 == 0) {
      otmp = mkobj(lev,'\x02','\0');
    }
    else {
      otmp = mksobj(lev,uVar8,'\x01','\0');
    }
  }
  if (allow_detrimental == '\0') {
    if ((otmp->field_0x4a & 1) == 0) {
      bless(otmp);
    }
    else {
      uncurse(otmp);
    }
    if (((byte)otmp->oclass - 2 < 2) ||
       ((otmp->oclass == 4 && ((objects[otmp->otyp].field_0x10 & 0x20) != 0)))) {
      if (otmp->spe < '\0') {
        cVar2 = '\0';
      }
      else {
        if (otmp->spe != '\0') goto LAB_0014a13b;
        uVar6 = mt_random();
        cVar2 = ((byte)uVar6 & 1) + 1;
      }
      otmp->spe = cVar2;
    }
  }
LAB_0014a13b:
  if (otmp->oartifact != '\0') {
    return otmp;
  }
  if ((objects[otmp->otyp].field_0x10 & 0x40) == 0) {
    cVar2 = otmp->oclass;
    if (cVar2 != '\x02') {
      if (cVar2 == '\x06') {
        if (objects[otmp->otyp].oc_subtyp == '\0') {
          return otmp;
        }
      }
      else if (2 < (byte)(cVar2 - 3U)) {
        return otmp;
      }
    }
    while ((otmp->oprops == 0 || (uVar6 = mt_random(), uVar6 * -0x33333333 < 0x33333334))) {
      uVar6 = mt_random();
      uVar3 = 1 << (sbyte)(uVar6 % 0x14);
      uVar9 = otmp->oprops;
      if (((((uint)uVar9 | 8) >> uVar6 % 0x14 & 1) == 0) &&
         ((allow_detrimental != '\0' || ((uVar3 & 0xc8000) == 0)))) {
        lVar10 = restrict_oprops(otmp,(ulong)uVar3);
        otmp->oprops = (long)(int)lVar10 | uVar9;
      }
    }
    if (((allow_detrimental != '\0') && ((otmp->oprops & 0xc8000U) != 0)) &&
       (uVar6 = mt_random(),
       0x19999999 < (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f))) {
      curse(otmp);
    }
    return otmp;
  }
  return otmp;
}

Assistant:

struct obj *create_oprop(struct level *lev, struct obj *otmp,
			 boolean allow_detrimental)
{
	if (!otmp) {
	    int type = 0;
	    int skill = P_NONE;
	    int candidates[128];
	    int ccount;
	    int threshold = P_EXPERT;
	    int i;

	    /* This probably is only ever done for weapons, y'know?
	     * Find an appropriate type of weapon */
	    while (threshold > P_UNSKILLED) {
		ccount = 0;
		for (i = P_FIRST_WEAPON; i < P_LAST_WEAPON; i++) {
		    if (P_MAX_SKILL(i) >= max(threshold, P_BASIC) &&
			P_SKILL(i) >= threshold)
			candidates[ccount++] = i;
		    if (ccount >= 128) break;
		}
		if (ccount == 0) {
		    threshold--;
		    continue;
		}
		skill = candidates[rn2(ccount)];
		if ((type = suitable_obj_for_skill(skill)))
		    break;

		ccount = 0;
		for (i = ARROW; i <= CROSSBOW; i++) {
		    if (abs(objects[i].oc_skill) == skill)
			candidates[ccount++] = i;
		    if (ccount == 128) break;
		}
		if (!ccount) {
		    impossible("found no weapons for skill %d?", skill);
		    threshold--;
		    continue;
		}
		type = candidates[rn2(ccount)];
		break;
	    }

	    /* Now make one, if we can */
	    if (type != 0)
		otmp = mksobj(lev, type, TRUE, FALSE);
	    else
		otmp = mkobj(lev, WEAPON_CLASS, FALSE);
	}

	/* Regardless if it's special or not, fix it up as necessary */
	if (!allow_detrimental) {
	    if (otmp->cursed) uncurse(otmp);
	    else bless(otmp);

	    if (otmp->oclass == WEAPON_CLASS ||
		otmp->oclass == ARMOR_CLASS ||
		(otmp->oclass == RING_CLASS && objects[otmp->otyp].oc_charged)) {
		if (otmp->spe < 0) otmp->spe = 0;
		else if (otmp->spe == 0) otmp->spe = rn1(2, 1);
	    }
	}

	/* Don't spruce up artifacts */
	if (otmp->oartifact) return otmp;
	else if (objects[otmp->otyp].oc_unique) return otmp;

	if (otmp->oclass != WEAPON_CLASS && !is_weptool(otmp) &&
	    otmp->oclass != AMULET_CLASS &&
	    otmp->oclass != RING_CLASS &&
	    otmp->oclass != ARMOR_CLASS)
	    return otmp;

	while (!otmp->oprops || !rn2(5)) {
	    int j = 1 << rn2(MAX_ITEM_PROPS); /* pick an item property */

	    if (otmp->oprops & j) continue;

	    /* don't randomly put insta-death weapons in monsters' hands */
	    if (j & ITEM_VORPAL) continue;

	    if ((j & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
		!allow_detrimental)
		continue;

	    j = restrict_oprops(otmp, j);
	    otmp->oprops |= j;
	}

	if ((otmp->oprops & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
	    allow_detrimental && rn2(10)) {
	    curse(otmp);
	}

	return otmp;
}